

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,cpp_function *args)

{
  handle *this_00;
  simple_collector<(pybind11::return_value_policy)1> *in_RDX;
  object_api<pybind11::handle> *in_RSI;
  handle in_RDI;
  cpp_function *in_stack_ffffffffffffffa8;
  PyObject *in_stack_ffffffffffffffe0;
  
  collect_arguments<(pybind11::return_value_policy)1,pybind11::cpp_function,void>
            (in_stack_ffffffffffffffa8);
  this_00 = derived(in_RSI);
  pybind11::handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call(in_RDX,in_stack_ffffffffffffffe0);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x39d69e);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}